

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

void __thiscall ON_wString::CopyToArray(ON_wString *this,int size,char *s)

{
  uint uVar1;
  wchar_t *pwVar2;
  ON_Internal_Empty_wString *pOVar3;
  
  if (((s != (char *)0x0 && 0 < size) && (*s != '\0')) &&
     (pwVar2 = ReserveArray(this,(ulong)(uint)size), pwVar2 != (wchar_t *)0x0)) {
    pwVar2 = this->m_s;
    pOVar3 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
    if (pwVar2 == (wchar_t *)0x0) {
      pOVar3 = &empty_wstring;
    }
    uVar1 = c2w(size,s,(pOVar3->header).string_capacity,pwVar2);
    pwVar2 = this->m_s;
    pOVar3 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
    if (pwVar2 == (wchar_t *)0x0) {
      pOVar3 = &empty_wstring;
    }
    (pOVar3->header).string_length = uVar1;
    pwVar2[uVar1] = L'\0';
    return;
  }
  Destroy(this);
  this->m_s = (wchar_t *)0x8431fc;
  return;
}

Assistant:

void ON_wString::CopyToArray( int size, const char* s )
{
  while (size > 0 && s && s[0])
  {
    if (nullptr == ReserveArray(size))
      break;
    // s = UTF-8 string.
    // m_s = UTF-8, UTF-16, or UTF-32 encoded string.
    // Even with errors, the number of wchar_t elements <= UTF-8 length
    Header()->string_length = c2w(size, s, Header()->string_capacity, m_s);
    m_s[Header()->string_length] = 0;
    return;
  }

  Destroy();
  Create();
}